

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O2

void rengine::animation_rotateZ(AnimationManager *manager,TransformNode *node,float duration)

{
  float *pfVar1;
  TransformNode *node_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_30 [8];
  shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>_>
  anim;
  
  anim.
  super___shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = duration;
  std::
  make_shared<rengine::Animation<rengine::TransformNode,float,&rengine::TransformNode::setMatrix_rotateAroundZ,&rengine::AnimationCurves::linear>,rengine::TransformNode*&>
            ((TransformNode **)local_30);
  AbstractAnimation::setDuration
            ((AbstractAnimation *)local_30,
             (double)anim.
                     super___shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._4_4_);
  AbstractAnimation::setIterations((AbstractAnimation *)local_30,-1);
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame((Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
                          *)local_30,0.0);
  *pfVar1 = 0.0;
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame((Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
                          *)local_30,1.0);
  *pfVar1 = 6.2831855;
  std::__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<rengine::Animation<rengine::TransformNode,float,&rengine::TransformNode::setMatrix_rotateAroundZ,&rengine::AnimationCurves::linear>,void>
            ((__shared_ptr<rengine::AbstractAnimation,(__gnu_cxx::_Lock_policy)2> *)&node_local,
             (__shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2>
              *)local_30);
  AnimationManager::start(manager,(shared_ptr<rengine::AbstractAnimation> *)&node_local,0.0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&anim);
  return;
}

Assistant:

inline void animation_rotateZ(AnimationManager *manager, TransformNode *node, float duration)
{
    auto anim = std::make_shared<Animation_aroundZ_linear>(node);
    anim->setDuration(duration);
    anim->setIterations(-1);
    anim->newKeyFrame(0) = 0;
    anim->newKeyFrame(1) = M_PI * 2;
    manager->start(anim);
}